

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_16x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  code *pcVar2;
  code *pcVar3;
  undefined8 uVar4;
  int8_t *piVar5;
  int iVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined7 in_register_00000009;
  undefined1 (*pauVar9) [16];
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined1 (*pauVar14) [16];
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar18 [16];
  undefined8 extraout_XMM1_Qb;
  __m128i round;
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar30;
  undefined1 in_XMM11 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar34 [16];
  __m128i out [32];
  undefined1 local_4a8 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_268 [4];
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined8 local_238 [30];
  undefined1 local_148 [280];
  
  piVar5 = av1_fwd_txfm_shift_ls[8];
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar2 = *(code **)((long)col_highbd_txfm8x8_arr + uVar7);
  pcVar3 = *(code **)((long)row_highbd_txfm8x16_arr + uVar7);
  pauVar14 = (undefined1 (*) [16])local_148;
  lVar12 = 0;
  lVar11 = 0;
  do {
    pauVar9 = (undefined1 (*) [16])((long)input + lVar12);
    iVar6 = (int)*piVar5;
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      local_448 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 7) * 2);
      local_438 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 6) * 2);
      local_428 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 5) * 2);
      local_418 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 4) * 2);
      local_408 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 3) * 2);
      local_3f8 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 2) * 2);
      local_3e8 = *(undefined1 (*) [16])((long)input + lVar12 + (long)stride * 2);
    }
    else {
      local_448 = *pauVar9;
      local_438 = *(undefined1 (*) [16])((long)input + lVar12 + (long)stride * 2);
      local_428 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 2) * 2);
      local_418 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 3) * 2);
      local_408 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 4) * 2);
      local_3f8 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 5) * 2);
      local_3e8 = *(undefined1 (*) [16])((long)input + lVar12 + (long)(stride * 6) * 2);
      pauVar9 = (undefined1 (*) [16])(input + lVar11 * 8 + (long)(stride * 7));
    }
    auVar17 = *pauVar9;
    auVar20 = pmovsxwd(in_XMM3,local_408);
    auVar16._8_4_ = local_408._8_4_;
    auVar16._12_4_ = local_408._12_4_;
    auVar16._0_8_ = local_408._8_8_;
    auVar24 = pmovsxwd(in_XMM7,auVar16);
    auVar22 = pmovsxwd(in_XMM5,local_3f8);
    auVar18._0_8_ = local_3f8._8_8_;
    auVar18._8_4_ = local_3f8._8_4_;
    auVar18._12_4_ = local_3f8._12_4_;
    auVar23 = pmovsxwd(in_XMM6,auVar18);
    auVar16 = pmovsxwd(auVar18,local_3e8);
    auVar19._8_4_ = local_3e8._8_4_;
    auVar19._12_4_ = local_3e8._12_4_;
    auVar19._0_8_ = local_3e8._8_8_;
    auVar21 = pmovsxwd(in_XMM4,auVar19);
    auVar18 = pmovsxwd(auVar19,auVar17);
    auVar17._0_8_ = auVar17._8_8_;
    auVar19 = pmovsxwd(auVar17,auVar17);
    auVar26 = pmovsxwd(in_XMM9,local_418);
    auVar27._8_4_ = local_418._8_4_;
    auVar27._12_4_ = local_418._12_4_;
    auVar27._0_8_ = local_418._8_8_;
    auVar27 = pmovsxwd(auVar27,auVar27);
    auVar29 = pmovsxwd(in_XMM11,local_428);
    auVar31._8_4_ = local_428._8_4_;
    auVar31._12_4_ = local_428._12_4_;
    auVar31._0_8_ = local_428._8_8_;
    auVar31 = pmovsxwd(in_XMM12,auVar31);
    auVar32 = pmovsxwd(in_XMM13,local_438);
    auVar33._8_4_ = local_438._8_4_;
    auVar33._12_4_ = local_438._12_4_;
    auVar33._0_8_ = local_438._8_8_;
    auVar33 = pmovsxwd(in_XMM14,auVar33);
    auVar34 = pmovsxwd(in_XMM15,local_448);
    auVar25._8_4_ = local_448._8_4_;
    auVar25._12_4_ = local_448._12_4_;
    auVar25._0_8_ = local_448._8_8_;
    auVar17 = pmovsxwd(auVar16,auVar25);
    local_448._4_4_ = auVar34._4_4_;
    local_448._0_4_ = auVar34._0_4_ << iVar6;
    local_448._8_4_ = auVar34._8_4_;
    local_448._12_4_ = auVar34._12_4_;
    local_438._4_4_ = auVar17._4_4_;
    local_438._0_4_ = auVar17._0_4_ << iVar6;
    local_438._8_4_ = auVar17._8_4_;
    local_438._12_4_ = auVar17._12_4_;
    local_428._4_4_ = auVar32._4_4_;
    local_428._0_4_ = auVar32._0_4_ << iVar6;
    local_428._8_4_ = auVar32._8_4_;
    local_428._12_4_ = auVar32._12_4_;
    local_418._4_4_ = auVar33._4_4_;
    local_418._0_4_ = auVar33._0_4_ << iVar6;
    local_418._8_4_ = auVar33._8_4_;
    local_418._12_4_ = auVar33._12_4_;
    local_408._4_4_ = auVar29._4_4_;
    local_408._0_4_ = auVar29._0_4_ << iVar6;
    local_408._8_4_ = auVar29._8_4_;
    local_408._12_4_ = auVar29._12_4_;
    local_3f8._4_4_ = auVar31._4_4_;
    local_3f8._0_4_ = auVar31._0_4_ << iVar6;
    local_3f8._8_4_ = auVar31._8_4_;
    local_3f8._12_4_ = auVar31._12_4_;
    local_3e8._4_4_ = auVar26._4_4_;
    local_3e8._0_4_ = auVar26._0_4_ << iVar6;
    local_3e8._8_4_ = auVar26._8_4_;
    local_3e8._12_4_ = auVar26._12_4_;
    local_3d8._4_4_ = auVar27._4_4_;
    local_3d8._0_4_ = auVar27._0_4_ << iVar6;
    local_3d8._8_4_ = auVar27._8_4_;
    local_3d8._12_4_ = auVar27._12_4_;
    local_3c8._4_4_ = auVar20._4_4_;
    local_3c8._0_4_ = auVar20._0_4_ << iVar6;
    uStack_3c0._0_4_ = auVar20._8_4_;
    uStack_3c0._4_4_ = auVar20._12_4_;
    local_3b8._4_4_ = auVar24._4_4_;
    local_3b8._0_4_ = auVar24._0_4_ << iVar6;
    uStack_3b0._0_4_ = auVar24._8_4_;
    uStack_3b0._4_4_ = auVar24._12_4_;
    local_3a8._4_4_ = auVar22._4_4_;
    local_3a8._0_4_ = auVar22._0_4_ << iVar6;
    uStack_3a0._0_4_ = auVar22._8_4_;
    uStack_3a0._4_4_ = auVar22._12_4_;
    local_398._4_4_ = auVar23._4_4_;
    local_398._0_4_ = auVar23._0_4_ << iVar6;
    local_398._8_4_ = auVar23._8_4_;
    local_398._12_4_ = auVar23._12_4_;
    local_4a8._0_4_ = auVar16._0_4_;
    local_4a8._4_4_ = auVar16._4_4_;
    local_4a8._8_4_ = auVar16._8_4_;
    local_4a8._12_4_ = auVar16._12_4_;
    local_388._4_4_ = local_4a8._4_4_;
    local_388._0_4_ = local_4a8._0_4_ << iVar6;
    uStack_380._0_4_ = local_4a8._8_4_;
    uStack_380._4_4_ = local_4a8._12_4_;
    local_378._4_4_ = auVar21._4_4_;
    local_378._0_4_ = auVar21._0_4_ << iVar6;
    uStack_370._0_4_ = auVar21._8_4_;
    uStack_370._4_4_ = auVar21._12_4_;
    local_368._4_4_ = auVar18._4_4_;
    local_368._0_4_ = auVar18._0_4_ << iVar6;
    local_368._8_4_ = auVar18._8_4_;
    local_368._12_4_ = auVar18._12_4_;
    local_358._4_4_ = auVar19._4_4_;
    local_358._0_4_ = auVar19._0_4_ << iVar6;
    uStack_350._0_4_ = auVar19._8_4_;
    uStack_350._4_4_ = auVar19._12_4_;
    (*pcVar2)(local_448,local_448,0xd,2);
    iVar6 = 1 << (~piVar5[1] & 0x1fU);
    auVar17 = ZEXT416((uint)-(int)piVar5[1]);
    local_448._0_4_ = local_448._0_4_ + iVar6 >> auVar17;
    local_448._4_4_ = local_448._4_4_ + iVar6 >> auVar17;
    local_448._8_4_ = local_448._8_4_ + iVar6 >> auVar17;
    local_448._12_4_ = local_448._12_4_ + iVar6 >> auVar17;
    local_438._0_4_ = local_438._0_4_ + iVar6 >> auVar17;
    local_438._4_4_ = local_438._4_4_ + iVar6 >> auVar17;
    local_438._8_4_ = local_438._8_4_ + iVar6 >> auVar17;
    local_438._12_4_ = local_438._12_4_ + iVar6 >> auVar17;
    local_428._0_4_ = local_428._0_4_ + iVar6 >> auVar17;
    local_428._4_4_ = local_428._4_4_ + iVar6 >> auVar17;
    local_428._8_4_ = local_428._8_4_ + iVar6 >> auVar17;
    local_428._12_4_ = local_428._12_4_ + iVar6 >> auVar17;
    local_248 = local_418._0_4_ + iVar6 >> auVar17;
    iStack_244 = local_418._4_4_ + iVar6 >> auVar17;
    iStack_240 = local_418._8_4_ + iVar6 >> auVar17;
    iStack_23c = local_418._12_4_ + iVar6 >> auVar17;
    iVar28 = local_408._0_4_ + iVar6 >> auVar17;
    iVar30 = local_408._4_4_ + iVar6 >> auVar17;
    local_408._0_8_ = CONCAT44(iVar30,iVar28);
    local_408._8_4_ = local_408._8_4_ + iVar6 >> auVar17;
    local_408._12_4_ = local_408._12_4_ + iVar6 >> auVar17;
    local_3f8._0_4_ = local_3f8._0_4_ + iVar6 >> auVar17;
    local_3f8._4_4_ = local_3f8._4_4_ + iVar6 >> auVar17;
    local_3f8._8_4_ = local_3f8._8_4_ + iVar6 >> auVar17;
    local_3f8._12_4_ = local_3f8._12_4_ + iVar6 >> auVar17;
    local_3e8._0_4_ = local_3e8._0_4_ + iVar6 >> auVar17;
    local_3e8._4_4_ = local_3e8._4_4_ + iVar6 >> auVar17;
    local_3e8._8_4_ = local_3e8._8_4_ + iVar6 >> auVar17;
    local_3e8._12_4_ = local_3e8._12_4_ + iVar6 >> auVar17;
    in_XMM12._0_4_ = local_3d8._0_4_ + iVar6 >> auVar17;
    in_XMM12._4_4_ = local_3d8._4_4_ + iVar6 >> auVar17;
    in_XMM12._8_4_ = local_3d8._8_4_ + iVar6 >> auVar17;
    in_XMM12._12_4_ = local_3d8._12_4_ + iVar6 >> auVar17;
    local_3c8._0_4_ = (int)local_3c8 + iVar6 >> auVar17;
    local_3c8._4_4_ = local_3c8._4_4_ + iVar6 >> auVar17;
    uStack_3c0._0_4_ = (int)uStack_3c0 + iVar6 >> auVar17;
    uStack_3c0._4_4_ = uStack_3c0._4_4_ + iVar6 >> auVar17;
    local_3b8._0_4_ = (int)local_3b8 + iVar6 >> auVar17;
    local_3b8._4_4_ = local_3b8._4_4_ + iVar6 >> auVar17;
    uStack_3b0._0_4_ = (int)uStack_3b0 + iVar6 >> auVar17;
    uStack_3b0._4_4_ = uStack_3b0._4_4_ + iVar6 >> auVar17;
    local_3a8._0_4_ = (int)local_3a8 + iVar6 >> auVar17;
    local_3a8._4_4_ = local_3a8._4_4_ + iVar6 >> auVar17;
    uStack_3a0._0_4_ = (int)uStack_3a0 + iVar6 >> auVar17;
    uStack_3a0._4_4_ = uStack_3a0._4_4_ + iVar6 >> auVar17;
    local_4a8._0_4_ = local_398._0_4_ + iVar6 >> auVar17;
    local_4a8._4_4_ = local_398._4_4_ + iVar6 >> auVar17;
    local_4a8._8_4_ = local_398._8_4_ + iVar6 >> auVar17;
    local_4a8._12_4_ = local_398._12_4_ + iVar6 >> auVar17;
    local_388._0_4_ = (int)local_388 + iVar6 >> auVar17;
    local_388._4_4_ = local_388._4_4_ + iVar6 >> auVar17;
    uStack_380._0_4_ = (int)uStack_380 + iVar6 >> auVar17;
    uStack_380._4_4_ = uStack_380._4_4_ + iVar6 >> auVar17;
    local_378._0_4_ = (int)local_378 + iVar6 >> auVar17;
    local_378._4_4_ = local_378._4_4_ + iVar6 >> auVar17;
    uStack_370._0_4_ = (int)uStack_370 + iVar6 >> auVar17;
    uStack_370._4_4_ = uStack_370._4_4_ + iVar6 >> auVar17;
    in_XMM13._0_4_ = local_368._0_4_ + iVar6 >> auVar17;
    in_XMM13._4_4_ = local_368._4_4_ + iVar6 >> auVar17;
    in_XMM13._8_4_ = local_368._8_4_ + iVar6 >> auVar17;
    in_XMM13._12_4_ = local_368._12_4_ + iVar6 >> auVar17;
    local_358._0_4_ = iVar6 + (int)local_358 >> auVar17;
    local_358._4_4_ = iVar6 + local_358._4_4_ >> auVar17;
    uStack_350._0_4_ = iVar6 + (int)uStack_350 >> auVar17;
    uStack_350._4_4_ = iVar6 + uStack_350._4_4_ >> auVar17;
    in_XMM15._4_4_ = local_428._0_4_;
    in_XMM15._0_4_ = local_448._0_4_;
    local_418._4_4_ = iStack_244;
    local_418._0_4_ = local_248;
    local_418._8_4_ = iStack_240;
    local_418._12_4_ = iStack_23c;
    auVar23._8_4_ = iVar30;
    auVar23._0_8_ = local_408._0_8_;
    auVar23._12_4_ = local_3e8._4_4_;
    in_XMM14._8_8_ = auVar23._8_8_;
    in_XMM14._0_8_ = CONCAT44(local_3e8._0_4_,iVar28);
    in_XMM11._0_8_ = CONCAT44(local_3e8._8_4_,local_408._8_4_);
    in_XMM11._8_4_ = local_408._12_4_;
    in_XMM11._12_4_ = local_3e8._12_4_;
    in_XMM15._8_8_ = in_XMM14._0_8_;
    pauVar14[-0xf] = in_XMM15;
    *(undefined4 *)(pauVar14[-0xd] + 8) = local_448._4_4_;
    *(undefined4 *)(pauVar14[-0xd] + 0xc) = local_428._4_4_;
    *(undefined8 *)(pauVar14[-0xd] + 8) = in_XMM14._8_8_;
    *(undefined4 *)pauVar14[-0xb] = local_448._8_4_;
    *(undefined4 *)(pauVar14[-0xb] + 4) = local_428._8_4_;
    *(undefined8 *)(pauVar14[-0xb] + 8) = in_XMM11._0_8_;
    *(undefined4 *)(pauVar14[-9] + 8) = local_448._12_4_;
    *(undefined4 *)(pauVar14[-9] + 0xc) = local_428._12_4_;
    *(long *)(pauVar14[-9] + 8) = in_XMM11._8_8_;
    in_XMM9._4_4_ = local_248;
    in_XMM9._0_4_ = local_438._0_4_;
    in_XMM9._12_4_ = in_XMM12._0_4_;
    in_XMM9._8_4_ = local_3f8._0_4_;
    pauVar14[-7] = in_XMM9;
    *(undefined4 *)(pauVar14[-5] + 8) = local_438._4_4_;
    *(int *)(pauVar14[-5] + 0xc) = iStack_244;
    *(undefined4 *)pauVar14[-4] = local_3f8._4_4_;
    *(int *)(pauVar14[-4] + 4) = in_XMM12._4_4_;
    *(undefined4 *)pauVar14[-3] = local_438._8_4_;
    *(int *)(pauVar14[-3] + 4) = iStack_240;
    *(undefined4 *)(pauVar14[-3] + 8) = local_3f8._8_4_;
    *(int *)(pauVar14[-3] + 0xc) = in_XMM12._8_4_;
    local_398 = local_4a8;
    *(undefined4 *)(pauVar14[-1] + 8) = local_438._12_4_;
    *(int *)(pauVar14[-1] + 0xc) = iStack_23c;
    *(undefined4 *)*pauVar14 = local_3f8._12_4_;
    *(int *)(*pauVar14 + 4) = in_XMM12._12_4_;
    in_XMM6._4_4_ = (int)local_3a8;
    in_XMM6._0_4_ = (int)local_3c8;
    auVar20._0_8_ = CONCAT44((int)uStack_3a0,(int)uStack_3c0);
    auVar20._8_4_ = uStack_3c0._4_4_;
    auVar20._12_4_ = uStack_3a0._4_4_;
    in_XMM6._12_4_ = in_XMM13._0_4_;
    in_XMM6._8_4_ = (int)local_388;
    auVar22._0_8_ = CONCAT44(in_XMM13._8_4_,(int)uStack_380);
    auVar22._8_4_ = uStack_380._4_4_;
    auVar22._12_4_ = in_XMM13._12_4_;
    pauVar14[-0xe] = in_XMM6;
    *(int *)(pauVar14[-0xc] + 8) = local_3c8._4_4_;
    *(int *)(pauVar14[-0xc] + 0xc) = local_3a8._4_4_;
    *(int *)pauVar14[-0xb] = local_388._4_4_;
    *(int *)(pauVar14[-0xb] + 4) = in_XMM13._4_4_;
    *(undefined8 *)pauVar14[-10] = auVar20._0_8_;
    *(undefined8 *)(pauVar14[-10] + 8) = auVar22._0_8_;
    in_XMM3._8_8_ = auVar22._8_8_;
    in_XMM3._0_8_ = auVar20._8_8_;
    pauVar14[-8] = in_XMM3;
    auVar21._0_8_ = CONCAT44(local_4a8._8_4_,(int)uStack_3b0);
    auVar21._8_4_ = uStack_3b0._4_4_;
    auVar21._12_4_ = local_4a8._12_4_;
    in_XMM5._0_8_ = CONCAT44((int)uStack_350,(int)uStack_370);
    in_XMM5._8_4_ = uStack_370._4_4_;
    in_XMM5._12_4_ = uStack_350._4_4_;
    *(ulong *)pauVar14[-6] = CONCAT44(local_4a8._0_4_,(int)local_3b8);
    *(ulong *)(pauVar14[-6] + 8) = CONCAT44((int)local_358,(int)local_378);
    *(int *)(pauVar14[-4] + 8) = local_3b8._4_4_;
    *(undefined4 *)(pauVar14[-4] + 0xc) = local_4a8._4_4_;
    *(int *)pauVar14[-3] = local_378._4_4_;
    *(int *)(pauVar14[-3] + 4) = local_358._4_4_;
    *(undefined8 *)pauVar14[-2] = auVar21._0_8_;
    *(undefined8 *)(pauVar14[-2] + 8) = in_XMM5._0_8_;
    in_XMM4._8_8_ = in_XMM5._8_8_;
    in_XMM4._0_8_ = auVar21._8_8_;
    *pauVar14 = in_XMM4;
    lVar11 = lVar11 + 1;
    pauVar14 = pauVar14 + 0x10;
    lVar12 = lVar12 + 0x10;
    in_XMM7 = local_4a8;
  } while (lVar12 == 0x10);
  puVar13 = local_238;
  puVar8 = puVar13;
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    uVar7 = 0xfffffffffffffffe;
    puVar8 = local_238;
    puVar10 = local_268;
    do {
      uVar4 = puVar8[1];
      *puVar10 = *puVar8;
      puVar10[1] = uVar4;
      uVar7 = uVar7 + 2;
      puVar10 = puVar10 + -4;
      puVar8 = puVar8 + 4;
    } while (uVar7 < 0x1e);
    puVar8 = local_268 + 2;
    uVar7 = 0xffffffffffffffff;
    puVar10 = local_238 + 2;
    do {
      uVar4 = puVar10[1];
      *puVar8 = *puVar10;
      puVar8[1] = uVar4;
      uVar7 = uVar7 + 2;
      puVar8 = puVar8 + -4;
      puVar10 = puVar10 + 4;
    } while (uVar7 < 0x1e);
    puVar8 = (undefined8 *)local_448;
  }
  local_3d8 = in_XMM12;
  local_368 = in_XMM13;
  auVar17 = (*pcVar3)(puVar8,puVar13,0xd,2);
  auVar26._0_8_ = auVar17._8_8_;
  auVar24._0_8_ = auVar17._0_8_;
  auVar26._8_8_ = extraout_XMM1_Qb;
  auVar24._8_8_ = extraout_XMM0_Qb;
  auVar17 = pmovsxwd(auVar24,0x16a116a116a116a1);
  auVar16 = pmovsxwd(auVar26,0x800080008000800);
  lVar11 = 0;
  do {
    iVar6 = (int)piVar5[2];
    if (iVar6 < 0) {
      iVar28 = 1 << (~piVar5[2] & 0x1fU);
      auVar18 = ZEXT416((uint)-iVar6);
      lVar12 = 0;
      do {
        piVar1 = (int *)((long)puVar13 + lVar12);
        auVar29._0_4_ = *piVar1 + iVar28 >> auVar18;
        auVar29._4_4_ = piVar1[1] + iVar28 >> auVar18;
        auVar29._8_4_ = piVar1[2] + iVar28 >> auVar18;
        auVar29._12_4_ = piVar1[3] + iVar28 >> auVar18;
        auVar19 = pmulld(auVar29,auVar17);
        *(int *)(local_448 + lVar12) = auVar19._0_4_ + auVar16._0_4_ >> 0xc;
        *(int *)(local_448 + lVar12 + 4) = auVar19._4_4_ + auVar16._4_4_ >> 0xc;
        *(int *)(local_448 + lVar12 + 8) = auVar19._8_4_ + auVar16._8_4_ >> 0xc;
        *(int *)(local_448 + lVar12 + 0xc) = auVar19._12_4_ + auVar16._12_4_ >> 0xc;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x100);
    }
    else {
      lVar12 = 0;
      do {
        piVar1 = (int *)((long)puVar13 + lVar12);
        auVar32._0_4_ = *piVar1 << iVar6;
        auVar32._4_4_ = piVar1[1];
        auVar32._8_4_ = piVar1[2];
        auVar32._12_4_ = piVar1[3];
        auVar18 = pmulld(auVar32,auVar17);
        *(int *)(local_448 + lVar12) = auVar18._0_4_ + auVar16._0_4_ >> 0xc;
        *(int *)(local_448 + lVar12 + 4) = auVar18._4_4_ + auVar16._4_4_ >> 0xc;
        *(int *)(local_448 + lVar12 + 8) = auVar18._8_4_ + auVar16._8_4_ >> 0xc;
        *(int *)(local_448 + lVar12 + 0xc) = auVar18._12_4_ + auVar16._12_4_ >> 0xc;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x100);
    }
    *(undefined8 *)(coeff + lVar11 * 0x40) = local_448._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 2) = local_448._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 4) = local_438._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 4 + 2) = local_438._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 8) = local_428._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 8 + 2) = local_428._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0xc) = local_418._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0xc + 2) = local_418._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x10) = local_408._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x10 + 2) = local_408._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x14) = local_3f8._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x14 + 2) = local_3f8._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x18) = local_3e8._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x18 + 2) = local_3e8._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x1c) = local_3d8._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x1c + 2) = local_3d8._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x20) = local_3c8;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x20 + 2) = uStack_3c0;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x24) = local_3b8;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x24 + 2) = uStack_3b0;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x28) = local_3a8;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x28 + 2) = uStack_3a0;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x2c) = local_398._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x2c + 2) = local_398._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x30) = local_388;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x30 + 2) = uStack_380;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x34) = local_378;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x34 + 2) = uStack_370;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x38) = local_368._0_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x38 + 2) = local_368._8_8_;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x3c) = local_358;
    *(undefined8 *)(coeff + lVar11 * 0x40 + 0x3c + 2) = uStack_350;
    puVar13 = puVar13 + 0x20;
    bVar15 = lVar11 == 0;
    lVar11 = lVar11 + 1;
  } while (bVar15);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    load_buffer_8x8(input + i * 8, in, stride, ud_flip, 0, shift[0]);
    col_txfm(in, in, bit, 2);
    col_txfm_8x8_rounding(in, -shift[1]);
    transpose_8x8(in, out + i * 16);
  }

  if (lr_flip) {
    flip_buf_sse4_1(in, out, 32);
    row_txfm(in, out, bit, 2);
  } else {
    row_txfm(out, out, bit, 2);
  }

  for (int i = 0; i < 2; i++) {
    av1_round_shift_rect_array_32_sse4_1(out + i * 16, in, 16, -shift[2],
                                         NewSqrt2);
    write_buffer_8x8(in, coeff + i * 64);
  }
  (void)bd;
}